

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::Library::FunctionSignatureExists(Library *this,FunctionSignature *signature)

{
  bool bVar1;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  local_50 [3];
  FunctionSignature *local_38;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  local_30;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  local_28;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  itr;
  lock_guard<std::mutex> lock;
  FunctionSignature *signature_local;
  Library *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->m_propertyMutex);
  local_30._M_current =
       (FunctionSignature *)
       std::
       vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
       ::begin(&this->m_functionList);
  local_38 = (FunctionSignature *)
             std::
             vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
             ::end(&this->m_functionList);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<Jinx::Impl::FunctionSignature_const*,std::vector<Jinx::Impl::FunctionSignature,Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,4096ul,16ul>>>,Jinx::Impl::FunctionSignature>
                       (local_30,(__normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
                                  )local_38,signature);
  local_50[0]._M_current =
       (FunctionSignature *)
       std::
       vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
       ::end(&this->m_functionList);
  bVar1 = __gnu_cxx::operator==(&local_28,local_50);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  return (bool)(bVar1 - 1U & 1);
}

Assistant:

inline_t bool Library::FunctionSignatureExists(const FunctionSignature & signature) const
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto itr = std::find(m_functionList.begin(), m_functionList.end(), signature);
		return itr == m_functionList.end() ? false : true;
	}